

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O1

int Ssw_ManSweep(Ssw_Man_t *p)

{
  void **ppvVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  Aig_Man_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Bar_Progress_t *p_00;
  Vec_Int_t *vPairs;
  int *piVar7;
  Vec_Ptr_t *pVVar8;
  char *__function;
  long lVar9;
  long lVar10;
  Aig_Obj_t *p1;
  uint uVar11;
  Aig_Obj_t *pAVar12;
  char *__file;
  char *__assertion;
  ulong uVar13;
  long lVar14;
  timespec ts;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  pAVar5 = Ssw_FramesWithClasses(p);
  p->pFrames = pAVar5;
  uVar11 = pAVar5->nObjs[3] - p->pAig->nRegs;
  if ((uVar11 & 1) == 0) {
    if (0 < (int)uVar11) {
      lVar14 = 0;
      do {
        pVVar8 = p->pFrames->vCos;
        lVar10 = (long)pVVar8->nSize;
        if ((lVar10 <= lVar14) || (lVar10 <= lVar14 + 1)) goto LAB_006b23f3;
        ppvVar1 = pVVar8->pArray;
        Ssw_NodesAreConstrained
                  (p,*(Aig_Obj_t **)((long)ppvVar1[lVar14] + 8),
                   *(Aig_Obj_t **)((long)ppvVar1[lVar14 + 1] + 8));
        lVar14 = lVar14 + 2;
      } while ((int)lVar14 < (int)uVar11);
    }
    if (0 < p->pAig->nRegs) {
      uVar13 = (ulong)uVar11;
      lVar14 = 0;
      do {
        if (((int)uVar13 < 0) ||
           (pVVar8 = p->pFrames->vCos, pVVar8->nSize <= (int)(uVar11 + (int)lVar14)))
        goto LAB_006b23f3;
        Ssw_CnfNodeAddToSolver
                  (p->pMSat,(Aig_Obj_t *)
                            (*(ulong *)((long)pVVar8->pArray[uVar13] + 8) & 0xfffffffffffffffe));
        lVar14 = lVar14 + 1;
        uVar13 = uVar13 + 1;
      } while (lVar14 < p->pAig->nRegs);
    }
    sat_solver_simplify(p->pMSat->pSat);
    iVar3 = p->pPars->nFramesK;
    p->pNodeToFrames[p->pAig->pConst1->Id * p->nFrames + iVar3] = p->pFrames->pConst1;
    pAVar5 = p->pAig;
    if (0 < pAVar5->nTruePis) {
      lVar14 = 0;
      do {
        if (pAVar5->vCis->nSize <= lVar14) goto LAB_006b23f3;
        pvVar2 = pAVar5->vCis->pArray[lVar14];
        pAVar6 = Aig_ObjCreateCi(p->pFrames);
        p->pNodeToFrames[*(int *)((long)pvVar2 + 0x24) * p->nFrames + iVar3] = pAVar6;
        lVar14 = lVar14 + 1;
        pAVar5 = p->pAig;
      } while (lVar14 < pAVar5->nTruePis);
    }
    iVar4 = clock_gettime(3,&local_40);
    if (iVar4 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    p->timeReduce = p->timeReduce + lVar14 + lVar9;
    p->fRefined = 0;
    Ssw_ClassesClearRefined(p->ppClasses);
    if (p->pPars->fVerbose == 0) {
      p_00 = (Bar_Progress_t *)0x0;
    }
    else {
      p_00 = Bar_ProgressStart(_stdout,p->pAig->vObjs->nSize);
    }
    if ((p->pPars->fEquivDump == 0) && (p->pPars->fEquivDump2 == 0)) {
      vPairs = (Vec_Int_t *)0x0;
    }
    else {
      vPairs = (Vec_Int_t *)malloc(0x10);
      vPairs->nCap = 1000;
      vPairs->nSize = 0;
      piVar7 = (int *)malloc(4000);
      vPairs->pArray = piVar7;
    }
    pVVar8 = p->pAig->vObjs;
    if (0 < pVVar8->nSize) {
      lVar9 = 0;
      do {
        pAVar6 = (Aig_Obj_t *)pVVar8->pArray[lVar9];
        if (pAVar6 != (Aig_Obj_t *)0x0) {
          if ((p->pPars->fVerbose != 0) &&
             ((p_00 == (Bar_Progress_t *)0x0 || (p_00->nItemsNext <= lVar9)))) {
            Bar_ProgressUpdate_int(p_00,(int)lVar9,(char *)0x0);
          }
          uVar11 = (uint)*(undefined8 *)&pAVar6->field_0x18;
          if (((uVar11 & 7) != 2) || ((pAVar6->field_0).CioId < p->pAig->nTruePis)) {
            if ((uVar11 & 7) - 7 < 0xfffffffe) goto LAB_006b2345;
            if (((ulong)pAVar6 & 1) != 0) {
              __assert_fail("!Aig_IsComplement(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswInt.h"
                            ,0xb9,"Aig_Obj_t *Ssw_ObjChild0Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
            }
            uVar13 = (ulong)pAVar6->pFanin0 & 0xfffffffffffffffe;
            if (uVar13 == 0) {
              pAVar12 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar12 = (Aig_Obj_t *)
                        ((ulong)((uint)pAVar6->pFanin0 & 1) ^
                        (ulong)p->pNodeToFrames[*(int *)(uVar13 + 0x24) * p->nFrames + iVar3]);
            }
            uVar13 = (ulong)pAVar6->pFanin1 & 0xfffffffffffffffe;
            if (uVar13 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)pAVar6->pFanin1 & 1) ^
                   (ulong)p->pNodeToFrames[*(int *)(uVar13 + 0x24) * p->nFrames + iVar3]);
            }
            pAVar12 = Aig_And(p->pFrames,pAVar12,p1);
            p->pNodeToFrames[pAVar6->Id * p->nFrames + iVar3] = pAVar12;
          }
          uVar11 = Ssw_ManSweepNode(p,pAVar6,iVar3,0,vPairs);
          p->fRefined = p->fRefined | uVar11;
        }
LAB_006b2345:
        lVar9 = lVar9 + 1;
        pVVar8 = p->pAig->vObjs;
      } while (lVar9 < pVVar8->nSize);
    }
    if (p->pPars->fVerbose != 0) {
      Bar_ProgressStop(p_00);
    }
    iVar3 = Ssw_ManSweep::Counter;
    if (p->pPars->fEquivDump != 0) {
      Ssw_ManSweep::Counter = Ssw_ManSweep::Counter + 1;
      Ssw_ManDumpEquivMiter(p->pAig,vPairs,iVar3,1);
    }
    if ((p->pPars->fEquivDump2 != 0) && (p->fRefined == 0)) {
      Ssw_ManDumpEquivMiter(p->pAig,vPairs,0,0);
    }
    if (vPairs != (Vec_Int_t *)0x0) {
      if (vPairs->pArray != (int *)0x0) {
        free(vPairs->pArray);
        vPairs->pArray = (int *)0x0;
      }
      free(vPairs);
    }
    return p->fRefined;
  }
  __assertion = "(nConstrPairs & 1) == 0";
  __file = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSweep.c"
  ;
  __function = "int Ssw_ManSweep(Ssw_Man_t *)";
LAB_006b2408:
  __assert_fail(__assertion,__file,0x184,__function);
LAB_006b23f3:
  __assertion = "i >= 0 && i < p->nSize";
  __file = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h";
  __function = "void *Vec_PtrEntry(Vec_Ptr_t *, int)";
  goto LAB_006b2408;
}

Assistant:

int Ssw_ManSweep( Ssw_Man_t * p )
{
    static int Counter;
    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObj2, * pObjNew;
    int nConstrPairs, i, f;
    abctime clk;
    Vec_Int_t * vObjPairs;

    // perform speculative reduction
clk = Abc_Clock();
    // create timeframes
    p->pFrames = Ssw_FramesWithClasses( p );
    // add constants
    nConstrPairs = Aig_ManCoNum(p->pFrames)-Aig_ManRegNum(p->pAig);
    assert( (nConstrPairs & 1) == 0 );
    for ( i = 0; i < nConstrPairs; i += 2 )
    {
        pObj  = Aig_ManCo( p->pFrames, i   );
        pObj2 = Aig_ManCo( p->pFrames, i+1 );
        Ssw_NodesAreConstrained( p, Aig_ObjChild0(pObj), Aig_ObjChild0(pObj2) );
    }
    // build logic cones for register inputs
    for ( i = 0; i < Aig_ManRegNum(p->pAig); i++ )
    {
        pObj  = Aig_ManCo( p->pFrames, nConstrPairs + i );
        Ssw_CnfNodeAddToSolver( p->pMSat, Aig_ObjFanin0(pObj) );//
    }
    sat_solver_simplify( p->pMSat->pSat );

    // map constants and PIs of the last frame
    f = p->pPars->nFramesK;
    Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, f, Aig_ObjCreateCi(p->pFrames) );
p->timeReduce += Abc_Clock() - clk;

    // sweep internal nodes
    p->fRefined = 0;
    Ssw_ClassesClearRefined( p->ppClasses );
    if ( p->pPars->fVerbose )
        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pAig) );
    vObjPairs = (p->pPars->fEquivDump || p->pPars->fEquivDump2)? Vec_IntAlloc(1000) : NULL;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( p->pPars->fVerbose )
            Bar_ProgressUpdate( pProgress, i, NULL );
        if ( Saig_ObjIsLo(p->pAig, pObj) )
            p->fRefined |= Ssw_ManSweepNode( p, pObj, f, 0, vObjPairs );
        else if ( Aig_ObjIsNode(pObj) )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            p->fRefined |= Ssw_ManSweepNode( p, pObj, f, 0, vObjPairs );
        }
    }
    if ( p->pPars->fVerbose )
        Bar_ProgressStop( pProgress );

    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
    if ( p->pPars->fEquivDump )
        Ssw_ManDumpEquivMiter( p->pAig, vObjPairs, Counter++, 1 );
    if ( p->pPars->fEquivDump2 && !p->fRefined )
        Ssw_ManDumpEquivMiter( p->pAig, vObjPairs, 0, 0 );
    Vec_IntFreeP( &vObjPairs );
    return p->fRefined;
}